

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::SortImports::ImportElem::ImportElem
          (ImportElem *this,UString *key,Fodder *adjacentFodder,Bind *bind)

{
  Bind *in_RDX;
  Bind *in_RSI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *unaff_retaddr;
  
  std::__cxx11::u32string::u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)in_RSI
             ,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
              in_RDX);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(unaff_retaddr,in_RDI);
  Local::Bind::Bind(in_RSI,in_RDX);
  return;
}

Assistant:

ImportElem(UString key, Fodder adjacentFodder, Local::Bind bind)
            : key(key), adjacentFodder(adjacentFodder), bind(bind)
        {
        }